

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

int ClipperLib::PointInPolygon(IntPoint *pt,OutPt *op)

{
  long lVar1;
  long lVar2;
  OutPt *pOVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  OutPt *pOVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  double dVar13;
  
  lVar1 = pt->X;
  lVar2 = pt->Y;
  iVar7 = 0;
  iVar9 = 0;
  pOVar8 = op;
  do {
    pOVar3 = pOVar8->Next;
    lVar4 = (pOVar3->Pt).Y;
    if (lVar4 - lVar2 == 0) {
      lVar5 = (pOVar3->Pt).X;
      if (lVar5 == lVar1) {
        return -1;
      }
      lVar11 = (pOVar8->Pt).Y;
      if (lVar11 != lVar2) goto LAB_00278c69;
      if (lVar1 <= (pOVar8->Pt).X != lVar1 < lVar5) {
        return -1;
      }
      lVar11 = lVar2;
      if (lVar4 < lVar2) goto LAB_00278c7c;
    }
    else {
      lVar11 = (pOVar8->Pt).Y;
LAB_00278c69:
      if (lVar2 <= lVar4 == lVar11 < lVar2) {
LAB_00278c7c:
        lVar5 = (pOVar8->Pt).X;
        lVar6 = (pOVar3->Pt).X;
        if (lVar5 < lVar1) {
          lVar12 = lVar6 - lVar1;
          if (lVar12 != 0 && lVar1 <= lVar6) {
LAB_00278ca0:
            dVar13 = (double)(lVar4 - lVar2) * (double)(lVar5 - lVar1) -
                     (double)(lVar11 - lVar2) * (double)lVar12;
            if ((dVar13 == 0.0) && (!NAN(dVar13))) {
              return -1;
            }
            iVar10 = 1 - iVar9;
            iVar9 = iVar7;
            if (lVar4 <= lVar11 != 0.0 < dVar13) {
              iVar9 = iVar10;
              iVar7 = iVar10;
            }
          }
        }
        else {
          lVar12 = lVar6 - lVar1;
          if (lVar12 == 0 || lVar6 < lVar1) goto LAB_00278ca0;
          iVar9 = 1 - iVar9;
          iVar7 = iVar9;
        }
      }
    }
    pOVar8 = pOVar3;
    if (pOVar3 == op) {
      return iVar9;
    }
  } while( true );
}

Assistant:

int PointInPolygon (const IntPoint &pt, OutPt *op)
{
  //returns 0 if false, +1 if true, -1 if pt ON polygon boundary
  int result = 0;
  OutPt* startOp = op;
  for(;;)
  {
    if (op->Next->Pt.Y == pt.Y)
    {
        if ((op->Next->Pt.X == pt.X) || (op->Pt.Y == pt.Y && 
          ((op->Next->Pt.X > pt.X) == (op->Pt.X < pt.X)))) return -1;
    }
    if ((op->Pt.Y < pt.Y) != (op->Next->Pt.Y < pt.Y))
    {
      if (op->Pt.X >= pt.X)
      {
        if (op->Next->Pt.X > pt.X) result = 1 - result;
        else
        {
          double d = (double)(op->Pt.X - pt.X) * (op->Next->Pt.Y - pt.Y) - 
            (double)(op->Next->Pt.X - pt.X) * (op->Pt.Y - pt.Y);
          if (!d) return -1;
          if ((d > 0) == (op->Next->Pt.Y > op->Pt.Y)) result = 1 - result;
        }
      } else
      {
        if (op->Next->Pt.X > pt.X)
        {
          double d = (double)(op->Pt.X - pt.X) * (op->Next->Pt.Y - pt.Y) - 
            (double)(op->Next->Pt.X - pt.X) * (op->Pt.Y - pt.Y);
          if (!d) return -1;
          if ((d > 0) == (op->Next->Pt.Y > op->Pt.Y)) result = 1 - result;
        }
      }
    } 
    op = op->Next;
    if (startOp == op) break;
  } 
  return result;
}